

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

void duckdb::Bit::BitwiseOr(bitstring_t *rhs,bitstring_t *lhs,bitstring_t *result)

{
  ulong uVar1;
  char *pcVar2;
  InvalidInputException *this;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  string local_40;
  
  uVar4 = *(ulong *)&lhs->value;
  pcVar2 = (lhs->value).pointer.ptr;
  if ((uint)uVar4 < 0xd) {
    uVar6 = uVar4 >> 0x20;
  }
  else {
    uVar6 = (ulong)(byte)*pcVar2;
  }
  uVar1 = *(ulong *)&rhs->value;
  pcVar3 = (rhs->value).pointer.ptr;
  if ((uint)uVar1 < 0xd) {
    uVar7 = uVar1 >> 0x20;
  }
  else {
    uVar7 = (ulong)(byte)*pcVar3;
  }
  if (((uVar4 & 0xffffffff) * 8 - (uVar6 & 0xff)) + -8 ==
      ((uVar1 & 0xffffffff) * 8 - (uVar7 & 0xff)) + -8) {
    if ((result->value).pointer.length < 0xd) {
      pcVar5 = (result->value).pointer.prefix;
    }
    else {
      pcVar5 = (result->value).pointer.ptr;
    }
    if ((rhs->value).pointer.length < 0xd) {
      pcVar3 = (rhs->value).pointer.prefix;
    }
    if ((lhs->value).pointer.length < 0xd) {
      pcVar2 = (lhs->value).pointer.prefix;
    }
    *pcVar5 = *pcVar2;
    if (1 < (lhs->value).pointer.length) {
      uVar4 = 1;
      do {
        pcVar5[uVar4] = pcVar3[uVar4] | pcVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 < (lhs->value).pointer.length);
    }
    Finalize(result);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot OR bit strings of different sizes","");
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Bit::BitwiseOr(const bitstring_t &rhs, const bitstring_t &lhs, bitstring_t &result) {
	if (Bit::BitLength(lhs) != Bit::BitLength(rhs)) {
		throw InvalidInputException("Cannot OR bit strings of different sizes");
	}

	uint8_t *buf = reinterpret_cast<uint8_t *>(result.GetDataWriteable());
	const uint8_t *r_buf = reinterpret_cast<const uint8_t *>(rhs.GetData());
	const uint8_t *l_buf = reinterpret_cast<const uint8_t *>(lhs.GetData());

	buf[0] = l_buf[0];
	for (idx_t i = 1; i < lhs.GetSize(); i++) {
		buf[i] = l_buf[i] | r_buf[i];
	}
	Bit::Finalize(result);
}